

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void rdmsr_(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    failDecode(pMyDisasm);
  }
  else {
    (pMyDisasm->Instruction).Category = 0xa0000;
    strcpy((pMyDisasm->Instruction).Mnemonic,"rdmsr");
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 1;
    (pMyDisasm->Operand1).Registers.gpr = 5;
    (pMyDisasm->Operand1).OpSize = 0x20;
    (pMyDisasm->Operand2).OpType = 0x20000;
    (pMyDisasm->Operand2).Registers.type = 1;
    (pMyDisasm->Operand2).Registers.gpr = 2;
    (pMyDisasm->Operand2).OpSize = 0x20;
  }
  return;
}

Assistant:

void __bea_callspec__ rdmsr_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }
  pMyDisasm->Instruction.Category = SYSTEM_INSTRUCTION;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rdmsr");
  #endif
  GV.EIP_++;
  pMyDisasm->Operand1.OpType = REGISTER_TYPE;
  pMyDisasm->Operand1.Registers.type = GENERAL_REG;
  pMyDisasm->Operand1.Registers.gpr = REG0+REG2;
  pMyDisasm->Operand1.OpSize = 32;
  pMyDisasm->Operand2.OpType = REGISTER_TYPE;
  pMyDisasm->Operand2.Registers.type = GENERAL_REG;
  pMyDisasm->Operand2.Registers.gpr = REG1;
  pMyDisasm->Operand2.OpSize = 32;
}